

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcFault.c
# Opt level: O3

void Cnf_AddSorder(sat_solver *p,int *pVars,int i,int k,int *pnVars)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  uint local_5c;
  uint local_58;
  uint local_54;
  long local_50;
  long local_48;
  ulong local_40;
  int *local_38;
  
  uVar1 = *pnVars;
  local_40 = (ulong)uVar1;
  *pnVars = uVar1 + 2;
  local_48 = (long)i;
  iVar4 = pVars[local_48];
  local_50 = (long)k;
  iVar2 = pVars[local_50];
  uVar1 = uVar1 * 2;
  local_58 = iVar4 * 2 + 1;
  local_5c = uVar1;
  iVar3 = sat_solver_addclause(p,(lit *)&local_5c,(lit *)&local_54);
  if (iVar3 != 0) {
    local_58 = iVar2 * 2 + 1;
    local_5c = uVar1;
    iVar3 = sat_solver_addclause(p,(lit *)&local_5c,(lit *)&local_54);
    if (iVar3 == 0) {
LAB_0059b142:
      __assert_fail("Cid",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bsat/satSolver.h"
                    ,0x19b,"int sat_solver_add_and(sat_solver *, int, int, int, int, int, int)");
    }
    local_58 = iVar4 * 2;
    local_54 = iVar2 * 2;
    local_5c = uVar1 | 1;
    iVar4 = sat_solver_addclause(p,(lit *)&local_5c,(lit *)&local_50);
    if (iVar4 != 0) {
      iVar5 = (int)local_40 + 1;
      iVar4 = pVars[local_48];
      iVar2 = pVars[local_50];
      uVar1 = iVar5 * 2 + 1;
      local_5c = uVar1;
      local_58 = iVar4 * 2;
      local_38 = pVars;
      iVar3 = sat_solver_addclause(p,(lit *)&local_5c,(lit *)&local_54);
      if (iVar3 == 0) goto LAB_0059b123;
      local_5c = uVar1;
      local_58 = iVar2 * 2;
      iVar3 = sat_solver_addclause(p,(lit *)&local_5c,(lit *)&local_54);
      if (iVar3 == 0) goto LAB_0059b142;
      local_5c = iVar5 * 2;
      local_58 = iVar4 * 2 | 1;
      local_54 = iVar2 * 2 | 1;
      iVar4 = sat_solver_addclause(p,(lit *)&local_5c,(lit *)&local_50);
      if (iVar4 != 0) {
        local_38[local_48] = (int)local_40;
        local_38[local_50] = iVar5;
        return;
      }
    }
    __assert_fail("Cid",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bsat/satSolver.h"
                  ,0x1a1,"int sat_solver_add_and(sat_solver *, int, int, int, int, int, int)");
  }
LAB_0059b123:
  __assert_fail("Cid",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bsat/satSolver.h"
                ,0x196,"int sat_solver_add_and(sat_solver *, int, int, int, int, int, int)");
}

Assistant:

static inline void Cnf_AddSorder( sat_solver * p, int * pVars, int i, int k, int * pnVars )
{
    int iVar1 = (*pnVars)++;
    int iVar2 = (*pnVars)++;
    sat_solver_add_and( p, iVar1, pVars[i], pVars[k], 1, 1, 1 );
    sat_solver_add_and( p, iVar2, pVars[i], pVars[k], 0, 0, 0 );
    pVars[i] = iVar1;
    pVars[k] = iVar2;
}